

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathErrMemory(xmlXPathContextPtr ctxt,char *extra)

{
  xmlChar *pxVar1;
  char *pcVar2;
  xmlChar buf [200];
  xmlChar local_e8 [200];
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    if (extra == (char *)0x0) {
      pcVar2 = "Memory allocation failed\n";
      extra = (char *)0x0;
    }
    else {
      pcVar2 = "Memory allocation failed : %s\n";
    }
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0xc,2,XML_ERR_FATAL,(char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0,
                    pcVar2);
  }
  else {
    xmlResetError(&ctxt->lastError);
    if (extra == (char *)0x0) {
      pcVar2 = "Memory allocation failed\n";
    }
    else {
      pcVar2 = (char *)local_e8;
      xmlStrPrintf((xmlChar *)pcVar2,200,"Memory allocation failed : %s\n",extra);
    }
    pxVar1 = xmlStrdup((xmlChar *)pcVar2);
    (ctxt->lastError).message = (char *)pxVar1;
    (ctxt->lastError).domain = 0xc;
    (ctxt->lastError).code = 2;
    if (ctxt->error != (xmlStructuredErrorFunc)0x0) {
      (*ctxt->error)(ctxt->userData,&ctxt->lastError);
    }
  }
  return;
}

Assistant:

static void
xmlXPathErrMemory(xmlXPathContextPtr ctxt, const char *extra)
{
    if (ctxt != NULL) {
        xmlResetError(&ctxt->lastError);
        if (extra) {
            xmlChar buf[200];

            xmlStrPrintf(buf, 200,
                         "Memory allocation failed : %s\n",
                         extra);
            ctxt->lastError.message = (char *) xmlStrdup(buf);
        } else {
            ctxt->lastError.message = (char *)
	       xmlStrdup(BAD_CAST "Memory allocation failed\n");
        }
        ctxt->lastError.domain = XML_FROM_XPATH;
        ctxt->lastError.code = XML_ERR_NO_MEMORY;
	if (ctxt->error != NULL)
	    ctxt->error(ctxt->userData, &ctxt->lastError);
    } else {
        if (extra)
            __xmlRaiseError(NULL, NULL, NULL,
                            NULL, NULL, XML_FROM_XPATH,
                            XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0,
                            extra, NULL, NULL, 0, 0,
                            "Memory allocation failed : %s\n", extra);
        else
            __xmlRaiseError(NULL, NULL, NULL,
                            NULL, NULL, XML_FROM_XPATH,
                            XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0,
                            NULL, NULL, NULL, 0, 0,
                            "Memory allocation failed\n");
    }
}